

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

void __thiscall RTVector3::accelToEuler(RTVector3 *this,RTVector3 *rollPitchYaw)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float __x;
  float fVar5;
  float fVar6;
  
  fVar4 = this->m_data[0];
  fVar6 = this->m_data[1];
  fVar3 = this->m_data[2];
  fVar5 = SQRT(fVar3 * fVar3 + fVar4 * fVar4 + fVar6 * fVar6);
  bVar1 = NAN(fVar5);
  bVar2 = fVar5 == 0.0;
  __x = fVar3 / fVar5;
  if ((bVar2) && (!bVar1)) {
    __x = fVar3;
  }
  fVar3 = fVar6 / fVar5;
  if ((bVar2) && (!bVar1)) {
    fVar3 = fVar6;
  }
  fVar6 = fVar4 / fVar5;
  if ((bVar2) && (!bVar1)) {
    fVar6 = fVar4;
  }
  fVar4 = atan2f(fVar3,__x);
  rollPitchYaw->m_data[0] = fVar4;
  fVar4 = atan2f(fVar6,SQRT(fVar3 * fVar3 + __x * __x));
  rollPitchYaw->m_data[1] = -fVar4;
  rollPitchYaw->m_data[2] = 0.0;
  return;
}

Assistant:

void RTVector3::accelToEuler(RTVector3& rollPitchYaw) const
{
    RTVector3 normAccel = *this;

    normAccel.normalize();

    rollPitchYaw.setX(atan2(normAccel.y(), normAccel.z()));
    rollPitchYaw.setY(-atan2(normAccel.x(), sqrt(normAccel.y() * normAccel.y() + normAccel.z() * normAccel.z())));
    rollPitchYaw.setZ(0);
}